

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O2

FUNCTION_RETURN
getDiskInfos_dev(vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *disk_by_uuid)

{
  double __x;
  int iVar1;
  pointer paVar2;
  dirent *pdVar3;
  int *piVar4;
  ssize_t sVar5;
  long lVar6;
  DIR *__dirp;
  pointer paVar7;
  uint out_size;
  pointer paVar8;
  char *__rhs;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  allocator local_a99;
  pointer local_a98;
  pointer local_a90;
  string label_dir;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range4;
  uint *local_a58;
  size_type local_a50;
  uint local_a48;
  undefined4 uStack_a44;
  undefined4 uStack_a40;
  undefined4 uStack_a3c;
  string cur_dir;
  string base_dir;
  string device_name_s;
  stat sym_stat;
  DiskInfo tmpDiskInfo;
  char device_name [1024];
  
  local_a90 = (pointer)disk_by_uuid;
  paVar2 = (pointer)opendir("/dev/disk/by-uuid");
  if (paVar2 == (pointer)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    _log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  }
  else {
    std::__cxx11::string::string((string *)&base_dir,"/dev/disk/by-uuid/",(allocator *)&tmpDiskInfo)
    ;
    local_a98 = paVar2;
LAB_0019aae1:
    while ((pdVar3 = readdir((DIR *)paVar2), pdVar3 != (dirent *)0x0 &&
           ((ulong)(((long)(disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>).
                          _M_impl.super__Vector_impl_data._M_start) / 0x510) < 0x28))) {
      if (pdVar3->d_name[0] == 'u') goto LAB_0019ab31;
      if ((pdVar3->d_name[0] != '.') ||
         ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))
         )) goto LAB_0019ab3f;
    }
    closedir((DIR *)paVar2);
    std::__cxx11::string::~string((string *)&base_dir);
  }
  paVar2 = (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar8 = (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)&label_dir,"/dev/disk/by-label",(allocator *)&base_dir);
  __dirp = opendir(label_dir._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    std::__cxx11::string::assign((char *)&label_dir);
    __dirp = opendir(label_dir._M_dataplus._M_p);
    if (__dirp == (DIR *)0x0) {
      piVar4 = __errno_location();
      strerror(*piVar4);
      _log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      goto LAB_0019afc4;
    }
  }
  local_a98 = paVar8;
  local_a90 = paVar2;
  while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
    if ((pdVar3->d_name[0] != '.') ||
       ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))))
    {
      std::operator+(&cur_dir,&label_dir,"/");
      std::operator+(&base_dir,&cur_dir,pdVar3->d_name);
      std::__cxx11::string::~string((string *)&cur_dir);
      iVar1 = stat(base_dir._M_dataplus._M_p,(stat *)&tmpDiskInfo);
      if (iVar1 == 0) {
        for (paVar2 = (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            paVar2 != (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
                      super__Vector_impl_data._M_finish; paVar2 = paVar2 + 1) {
          if (paVar2->id == tmpDiskInfo.device._4_4_) {
            license::mstrlcpy(paVar2->label,pdVar3->d_name,0xff);
            paVar2->label_initialized = true;
            _log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            break;
          }
        }
      }
      else {
        piVar4 = __errno_location();
        strerror(*piVar4);
        _log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      }
      std::__cxx11::string::~string((string *)&base_dir);
    }
  }
  closedir(__dirp);
  paVar8 = local_a98;
  paVar2 = local_a90;
LAB_0019afc4:
  std::__cxx11::string::~string((string *)&label_dir);
  return (FUNCTION_RETURN)(paVar8 == paVar2);
LAB_0019ab31:
  if ((pdVar3->d_name[1] != 's') || (pdVar3->d_name[2] != 'b')) {
LAB_0019ab3f:
    __rhs = pdVar3->d_name;
    std::operator+(&cur_dir,&base_dir,__rhs);
    iVar1 = stat(cur_dir._M_dataplus._M_p,(stat *)&sym_stat);
    if (iVar1 == 0) {
      tmpDiskInfo.id = (int)sym_stat.st_ino;
      sVar5 = readlink(cur_dir._M_dataplus._M_p,device_name,0x3ff);
      if (sVar5 == -1) {
        piVar4 = __errno_location();
        strerror(*piVar4);
        _log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      }
      else {
        device_name[sVar5] = '\0';
        device_name_s._M_dataplus._M_p = (pointer)&device_name_s.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&device_name_s,device_name,device_name + sVar5);
        lVar6 = std::__cxx11::string::find_last_of((char *)&device_name_s,0x439f83);
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)&label_dir,(ulong)&device_name_s);
          std::__cxx11::string::operator=((string *)&device_name_s,(string *)&label_dir);
          std::__cxx11::string::~string((string *)&label_dir);
        }
        license::mstrlcpy(tmpDiskInfo.device,device_name_s._M_dataplus._M_p,0x400);
        parseUUID(__rhs,tmpDiskInfo.disk_sn,out_size);
        tmpDiskInfo.sn_initialized = true;
        tmpDiskInfo.label_initialized = false;
        tmpDiskInfo.preferred = false;
        paVar2 = (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        paVar8 = (disk_infos->super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          paVar7 = paVar8;
          if (paVar7 == paVar2) break;
          paVar8 = paVar7 + 1;
        } while (tmpDiskInfo.id != paVar7->id);
        std::__cxx11::string::string((string *)&local_a58,__rhs,&local_a99);
        label_dir._M_string_length = local_a50;
        if (local_a58 == &local_a48) {
          label_dir.field_2._8_4_ = uStack_a40;
          label_dir.field_2._12_4_ = uStack_a3c;
          label_dir._M_dataplus._M_p = (pointer)&label_dir.field_2;
        }
        else {
          label_dir._M_dataplus._M_p = (pointer)local_a58;
        }
        label_dir.field_2._M_allocated_capacity._4_4_ = uStack_a44;
        label_dir.field_2._M_allocated_capacity._0_4_ = local_a48;
        local_a50 = 0;
        local_a48 = local_a48 & 0xffffff00;
        local_a58 = &local_a48;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,int>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_a90,&label_dir);
        std::__cxx11::string::~string((string *)&label_dir);
        __x = (double)std::__cxx11::string::~string((string *)&local_a58);
        if (paVar7 == paVar2) {
          _log(__x);
          std::vector<DiskInfo,_std::allocator<DiskInfo>_>::push_back(disk_infos,&tmpDiskInfo);
        }
        std::__cxx11::string::~string((string *)&device_name_s);
        paVar2 = local_a98;
      }
    }
    else {
      piVar4 = __errno_location();
      strerror(*piVar4);
      _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    std::__cxx11::string::~string((string *)&cur_dir);
  }
  goto LAB_0019aae1;
}

Assistant:

FUNCTION_RETURN getDiskInfos_dev(std::vector<DiskInfo> &disk_infos,
								 std::unordered_map<std::string, int> &disk_by_uuid) {
	struct dirent *dir = NULL;
	struct stat sym_stat;
	FUNCTION_RETURN result;
	char device_name[MAX_PATH];

	DIR *disk_by_uuid_dir = opendir(ID_FOLDER);
	if (disk_by_uuid_dir == nullptr) {
		LOG_DEBUG("Open " ID_FOLDER " fail: %s", std::strerror(errno));
	} else {
		const std::string base_dir(ID_FOLDER "/");
		while ((dir = readdir(disk_by_uuid_dir)) != nullptr && disk_infos.size() < MAX_UNITS) {
			if (::strcmp(dir->d_name, ".") == 0 || ::strcmp(dir->d_name, "..") == 0 ||
				::strncmp(dir->d_name, "usb", 3) == 0) {
				continue;
			}

			std::string cur_dir = base_dir + dir->d_name;
			if (stat(cur_dir.c_str(), &sym_stat) == 0) {
				DiskInfo tmpDiskInfo;
				tmpDiskInfo.id = sym_stat.st_ino;
				ssize_t len = ::readlink(cur_dir.c_str(), device_name, MAX_PATH - 1);
				if (len != -1) {
					device_name[len] = '\0';
					std::string device_name_s(device_name, len);
					auto pos = device_name_s.find_last_of("/");
					if (pos != std::string::npos) {
						device_name_s = device_name_s.substr(pos + 1);
					}
					mstrlcpy(tmpDiskInfo.device, device_name_s.c_str(), sizeof(tmpDiskInfo.device));
					PARSE_ID_FUNC(dir->d_name, tmpDiskInfo.disk_sn, sizeof(tmpDiskInfo.disk_sn));
					tmpDiskInfo.sn_initialized = true;
					tmpDiskInfo.label_initialized = false;
					tmpDiskInfo.preferred = false;
					bool found = false;
					for (auto diskInfo : disk_infos) {
						if (tmpDiskInfo.id == diskInfo.id) {
							found = true;
							break;
						}
					}
					disk_by_uuid.insert(std::pair<std::string, int>(std::string(dir->d_name), tmpDiskInfo.id));
					if (!found) {
						LOG_DEBUG("Found disk inode %d device %s, sn %s", sym_stat.st_ino, tmpDiskInfo.device,
								  dir->d_name);
						disk_infos.push_back(tmpDiskInfo);
					}
				} else {
					LOG_DEBUG("Error %s during readlink of %s", std::strerror(errno), cur_dir.c_str());
				}
			} else {
				LOG_DEBUG("Error %s during stat of %s", std::strerror(errno), cur_dir.c_str());
			}
		}
		closedir(disk_by_uuid_dir);
	}

	result = disk_infos.size() > 0 ? FUNCTION_RETURN::FUNC_RET_OK : FUNCTION_RETURN::FUNC_RET_NOT_AVAIL;
	read_disk_labels(disk_infos);
	return result;
}